

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::reset(QTreeView *this)

{
  QTreeViewPrivate *this_00;
  QTreeViewPrivate *d;
  QAbstractItemView *in_stack_00000028;
  
  this_00 = d_func((QTreeView *)0x8fb2cb);
  QSet<QPersistentModelIndex>::clear((QSet<QPersistentModelIndex> *)0x8fb2e1);
  QSet<QPersistentModelIndex>::clear((QSet<QPersistentModelIndex> *)0x8fb2f2);
  QSet<QPersistentModelIndex>::clear((QSet<QPersistentModelIndex> *)0x8fb303);
  QList<QTreeViewItem>::clear((QList<QTreeViewItem> *)this_00);
  QAbstractItemView::reset(in_stack_00000028);
  return;
}

Assistant:

void QTreeView::reset()
{
    Q_D(QTreeView);
    d->expandedIndexes.clear();
    d->hiddenIndexes.clear();
    d->spanningIndexes.clear();
    d->viewItems.clear();
    QAbstractItemView::reset();
}